

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglshaderprogram.h
# Opt level: O1

GLint __thiscall rengine::OpenGLShaderProgram::resolve(OpenGLShaderProgram *this,char *name)

{
  int iVar1;
  ostream *poVar2;
  char *local_40;
  long local_38;
  
  iVar1 = glGetUniformLocation(this->m_id);
  if (-1 < iVar1) {
    return iVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"E [",3);
  log_timestring_abi_cxx11_();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]: ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"GLint rengine::OpenGLShaderProgram::resolve(const char *)",0x39);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"failed to resolve uniform: \'",0x1c);
  poVar2 = std::operator<<(poVar2,name);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'..",3);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_40);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglshaderprogram.h"
                ,0x36,"GLint rengine::OpenGLShaderProgram::resolve(const char *)");
}

Assistant:

GLint resolve(const char *name) {
        GLint id = glGetUniformLocation(m_id, name);
        if (id < 0) {
            loge << "failed to resolve uniform: '" << name << "'.." << std::endl;
            assert(false);
        }
        return id;
    }